

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  double dVar1;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if ((key == 0x100) && (action == 1)) {
    glfwSetWindowShouldClose(window,1);
  }
  if ((key == 0x48) && (action == 1)) {
    currentMode = (currentMode + 1) % numMode;
  }
  if ((key == 0x43) && (action == 1)) {
    def_r = def_r + 0.1;
    def_g = def_g + 0.1;
    def_b = def_b + 0.1;
    dVar1 = std::floor((double)(ulong)(uint)def_r);
    def_r = def_r - SUB84(dVar1,0);
    dVar1 = std::floor((double)(ulong)(uint)def_g);
    def_g = def_g - SUB84(dVar1,0);
    dVar1 = std::floor((double)(ulong)(uint)def_b);
    def_b = def_b - SUB84(dVar1,0);
  }
  if ((key == 0x106) && (action == 1)) {
    CMU462::MeshResampler::upsample(mesh);
    mesh_dirty = true;
  }
  if ((key == 0x107) && (action == 1)) {
    CMU462::MeshResampler::downsample(mesh);
    mesh_dirty = true;
  }
  if ((-1 < key) && (key < 0x400)) {
    if (action == 1) {
      keys[key] = true;
    }
    else if (action == 0) {
      keys[key] = false;
    }
  }
  return;
}

Assistant:

void key_callback(GLFWwindow *window, int key, [[maybe_unused]] int scancode, int action, [[maybe_unused]] int mods) {
    if (key == GLFW_KEY_ESCAPE && action == GLFW_PRESS)
        glfwSetWindowShouldClose(window, GL_TRUE);
    if (key == GLFW_KEY_H && action == GLFW_PRESS) {
        currentMode = (currentMode + 1) % numMode;
    }
    if (key == GLFW_KEY_C && action == GLFW_PRESS) {
        def_r += 0.1f;
        def_g += 0.1f;
        def_b += 0.1f;
        def_r -= floor(def_r);
        def_g -= floor(def_g);
        def_b -= floor(def_b);
    }
    if (key == GLFW_KEY_RIGHT && action == GLFW_PRESS) {
        MeshResampler::upsample(*mesh);
        mesh_dirty = true;
    }
    if (key == GLFW_KEY_LEFT && action == GLFW_PRESS) {
        MeshResampler::downsample(*mesh);
        mesh_dirty = true;
    }
    if (key >= 0 && key < 1024) {
        if (action == GLFW_PRESS)
            keys[key] = true;
        else if (action == GLFW_RELEASE)
            keys[key] = false;
    }
}